

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void CVmBifTADS::get_min(uint argc)

{
  int iVar1;
  uint idx;
  vm_val_t *pvVar2;
  uint in_EDI;
  vm_val_t ele;
  uint cnt;
  vm_val_t lst;
  vm_val_t cur_min;
  uint i;
  vm_val_t *in_stack_ffffffffffffffc0;
  vm_val_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  vm_val_t *ret;
  uint local_8;
  
  if (in_EDI == 0) {
    err_throw(0);
  }
  pvVar2 = CVmStack::get(0);
  ret = *(vm_val_t **)pvVar2;
  pvVar2 = (vm_val_t *)(pvVar2->val).native_desc;
  if ((in_EDI == 1) &&
     (iVar1 = vm_val_t::is_listlike
                        ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
     iVar1 != 0)) {
    idx = vm_val_t::ll_length(in_stack_ffffffffffffffc8);
    if (idx == 0) {
      err_throw(0);
    }
    vm_val_t::ll_index(pvVar2,ret,idx);
    for (local_8 = 2; local_8 <= idx; local_8 = local_8 + 1) {
      vm_val_t::ll_index(pvVar2,ret,idx);
      vm_val_t::compare_to(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    }
  }
  else {
    for (local_8 = 1; local_8 < in_EDI; local_8 = local_8 + 1) {
      CVmStack::get((ulong)local_8);
      iVar1 = vm_val_t::compare_to(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      if (iVar1 < 0) {
        CVmStack::get((ulong)local_8);
      }
    }
  }
  CVmStack::discard(in_EDI);
  CVmBif::retval(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void CVmBifTADS::get_min(VMG_ uint argc)
{
    uint i;
    vm_val_t cur_min;

    /* make sure we have at least one argument */
    if (argc < 1)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* start with the first argument as the presumptive minimum */
    cur_min = *G_stk->get(0);

    /* if there's one list-like argument, get the max of the list elements */
    if (argc == 1 && cur_min.is_listlike(vmg0_))
    {
        /* get the list length */
        vm_val_t lst = cur_min;
        uint cnt = lst.ll_length(vmg0_);

        /* if it's a zero-element list, it's an error */
        if (cnt == 0)
            err_throw(VMERR_BAD_VAL_BIF);

        /* get the first element as the tentative maximum */
        lst.ll_index(vmg_ &cur_min, 1);

        /* compare each additional list element */
        for (i = 2 ; i <= cnt ; ++i)
        {
            /* compare the current element and keep it if it's the highest */
            vm_val_t ele;
            lst.ll_index(vmg_ &ele, i);
            if (ele.compare_to(vmg_ &cur_min) < 0)
                cur_min = ele;
        }
    }
    else
    {
        /* compare each argument in turn */
        for (i = 1 ; i < argc ; ++i)
        {
            /* 
             *   compare this value to the minimum so far; if this value is
             *   less, it becomes the new minimum so far 
             */
            if (G_stk->get(i)->compare_to(vmg_ &cur_min) < 0)
                cur_min = *G_stk->get(i);
        }
    }

    /* discard the arguments */
    G_stk->discard(argc);

    /* return the minimum value */
    retval(vmg_ &cur_min);
}